

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O2

float crnlib::lanczos6_filter(float t)

{
  float fVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  
  fVar4 = -t;
  if (-t <= t) {
    fVar4 = t;
  }
  fVar1 = 0.0;
  if (fVar4 < 6.0) {
    dVar2 = sinc((double)fVar4);
    dVar3 = sinc((double)(fVar4 / 6.0));
    fVar1 = 0.0;
    if (1.249999968422344e-05 <= ABS(dVar3 * dVar2)) {
      fVar1 = (float)(dVar3 * dVar2);
    }
  }
  return fVar1;
}

Assistant:

static float lanczos6_filter(float t) {
  if (t < 0.0f)
    t = -t;

  if (t < 6.0f)
    return clean(sinc(t) * sinc(t / 6.0f));
  else
    return (0.0f);
}